

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactStateMachine.cpp
# Opt level: O2

void __thiscall
iDynTree::ContactStateMachine::ContactStateMachine(ContactStateMachine *this,SchmittParams *s)

{
  SchmittTrigger *this_00;
  pointer __p;
  __uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_> local_20
  ;
  
  (this->m_contactSchmitt)._M_t.
  super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>.
  _M_t.
  super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
  .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl = (SchmittTrigger *)0x0;
  this->m_previousState = true;
  this->m_currentState = true;
  this_00 = (SchmittTrigger *)operator_new(0x48);
  SchmittTrigger::SchmittTrigger
            (this_00,s->stableTimeContactBreak,s->stableTimeContactMake,
             s->contactBreakForceThreshold,s->contactMakeForceThreshold);
  local_20._M_t.
  super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
  .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl =
       (tuple<iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>)
       (_Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
       )0x0;
  std::__uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>::
  reset((__uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_> *
        )this,this_00);
  std::unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>::
  ~unique_ptr((unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
               *)&local_20);
  ((this->m_contactSchmitt)._M_t.
   super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>.
   _M_t.
   super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
   .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl)->m_currentState =
       this->m_previousState;
  return;
}

Assistant:

ContactStateMachine::ContactStateMachine(const SchmittParams& s) : m_previousState(true), 
                                                                   m_currentState(true)                                                                   
{
    m_contactSchmitt = std::unique_ptr<SchmittTrigger>(new SchmittTrigger(s.stableTimeContactBreak, 
                                                                          s.stableTimeContactMake,
                                                                          s.contactBreakForceThreshold,
                                                                          s.contactMakeForceThreshold));
    m_contactSchmitt.get()->setInitialState(m_previousState);
}